

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  ostream *poVar2;
  Mat local_280 [96];
  Mat local_220 [96];
  double local_1c0;
  double recall;
  double precision;
  undefined1 local_190 [40];
  Mat matOutput;
  pointer local_160;
  undefined1 local_110 [32];
  undefined1 local_f0 [40];
  Mat matTruth;
  pointer local_c0;
  undefined1 local_60 [8];
  arguments_t args;
  char **argv_local;
  int argc_local;
  
  args.parameters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  arguments_t::arguments_t((arguments_t *)local_60,argc,argv);
  sVar1 = arguments_t::parametersSize((arguments_t *)local_60);
  if (sVar1 < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar2 = std::operator<<(poVar2,*(char **)args.parameters.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar2 = std::operator<<(poVar2," truth binary_image");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    arguments_t::operator[][abi_cxx11_((arguments_t *)local_f0,(int)local_60);
    cv::imread((string *)(local_f0 + 0x20),(int)local_f0);
    std::__cxx11::string::~string((string *)local_f0);
    if (local_c0 == (pointer)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Cannot load ");
      arguments_t::operator[][abi_cxx11_((arguments_t *)local_110,(int)local_60);
      poVar2 = std::operator<<(poVar2,(string *)local_110);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_110);
    }
    else {
      arguments_t::operator[][abi_cxx11_((arguments_t *)local_190,(int)local_60);
      cv::imread((string *)(local_190 + 0x20),(int)local_190);
      std::__cxx11::string::~string((string *)local_190);
      if (local_160 == (pointer)0x0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Cannot load ");
        arguments_t::operator[][abi_cxx11_((arguments_t *)&precision,(int)local_60);
        poVar2 = std::operator<<(poVar2,(string *)&precision);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&precision);
      }
      else {
        cv::Mat::Mat(local_220,(Mat *)(local_f0 + 0x20));
        cv::Mat::Mat(local_280,(Mat *)(local_190 + 0x20));
        score(local_220,local_280,1,&recall,&local_1c0);
        cv::Mat::~Mat(local_280);
        cv::Mat::~Mat(local_220);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c0);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      cv::Mat::~Mat((Mat *)(local_190 + 0x20));
    }
    cv::Mat::~Mat((Mat *)(local_f0 + 0x20));
  }
  arguments_t::~arguments_t((arguments_t *)local_60);
  return 0;
}

Assistant:

int main(int argc, char** argv) {

	arguments_t args(argc, argv);

	if (args.parametersSize() < 2) {
		std::cout << "usage: " << argv[0] << " truth binary_image" << std::endl;
		return 0;
	}

	cv::Mat matTruth = cv::imread(args[0], cv::IMREAD_GRAYSCALE);
	if (!matTruth.data) {
		std::cout << "Cannot load " << args[0] << std::endl;
		return 0;
	}

	cv::Mat matOutput = cv::imread(args[1], cv::IMREAD_GRAYSCALE);
	if (!matOutput.data) {
		std::cout << "Cannot load " << args[1] << std::endl;
		return 0;
	}

	double precision, recall;
	score(matTruth, matOutput, 1, precision, recall);

	std::cout << recall << std::endl;

	return 0;
}